

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::get_curv_edge_vert_flips
          (Omega_h *this,Mesh *mesh,Adj *curv_verts2edges,LOs *edge2curv_edge)

{
  LO LVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  void *extraout_RDX;
  Read<signed_char> RVar5;
  Write<signed_char> out;
  Read<signed_char> in;
  type f;
  Write<signed_char> local_190;
  Write<signed_char> local_180;
  Write<int> local_170;
  Write<signed_char> local_160;
  Adj local_150;
  Write<signed_char> local_120;
  Write<signed_char> local_110;
  Adj local_100;
  Write<signed_char> local_d0;
  Write<signed_char> local_c0;
  Adj local_b0;
  Write<signed_char> local_80;
  Write<signed_char> local_70;
  Adj local_60;
  
  Adj::Adj(&local_60,curv_verts2edges);
  Write<int>::Write(&local_170,&edge2curv_edge->write_);
  get_curv_vert_edge_flips((Omega_h *)&local_160,&local_60,(LOs *)&local_170);
  Write<int>::~Write(&local_170);
  Adj::~Adj(&local_60);
  LVar1 = Mesh::nedges(mesh);
  std::__cxx11::string::string((string *)&local_150,"",(allocator *)&local_100);
  Write<signed_char>::Write(&local_190,LVar1 * 2,'\0',(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  uVar2 = Graph::nnodes(&curv_verts2edges->super_Graph);
  Adj::Adj(&local_b0,curv_verts2edges);
  Write<signed_char>::Write(&local_80,&local_190);
  Write<signed_char>::Write(&local_70,&local_160);
  Adj::Adj(&local_100,&local_b0);
  Write<signed_char>::Write(&local_d0,&local_80);
  Write<signed_char>::Write(&local_c0,&local_70);
  if (0 < (int)uVar2) {
    entering_parallel = 1;
    Adj::Adj(&local_150,&local_100);
    Write<signed_char>::Write(&local_120,&local_d0);
    Write<signed_char>::Write(&local_110,&local_c0);
    entering_parallel = 0;
    for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      for (lVar4 = (long)*(int *)((long)local_150.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                                 uVar3 * 4);
          lVar4 < *(int *)((long)local_150.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                          uVar3 * 4 + 4); lVar4 = lVar4 + 1) {
        *(undefined1 *)
         ((long)local_120.shared_alloc_.direct_ptr +
         (long)(*(char *)((long)local_150.codes.write_.shared_alloc_.direct_ptr + lVar4) >> 3) +
         (long)*(int *)((long)local_150.super_Graph.ab2b.write_.shared_alloc_.direct_ptr + lVar4 * 4
                       ) * 2) = *(undefined1 *)((long)local_110.shared_alloc_.direct_ptr + lVar4);
      }
    }
    get_curv_edge_vert_flips(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
              ((__0 *)&local_150);
  }
  get_curv_edge_vert_flips(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)&local_100);
  Write<signed_char>::Write(&local_180,&local_190);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_180);
  Write<signed_char>::~Write(&local_180);
  get_curv_edge_vert_flips(Omega_h::Mesh*,Omega_h::Adj,Omega_h::Read<int>)::$_0::~__0
            ((__0 *)&local_b0);
  Write<signed_char>::~Write(&local_190);
  Write<signed_char>::~Write(&local_160);
  RVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar5.write_.shared_alloc_;
}

Assistant:

Read<I8> get_curv_edge_vert_flips(
    Mesh* mesh, Adj curv_verts2edges, LOs edge2curv_edge) {
  auto in = get_curv_vert_edge_flips(curv_verts2edges, edge2curv_edge);
  auto out = Write<I8>(mesh->nedges() * 2, I8(0));
  auto ncurv_verts = curv_verts2edges.nnodes();
  auto f = OMEGA_H_LAMBDA(LO curv_vert) {
    for (auto ve = curv_verts2edges.a2ab[curv_vert];
         ve < curv_verts2edges.a2ab[curv_vert + 1]; ++ve) {
      auto e = curv_verts2edges.ab2b[ve];
      auto code = curv_verts2edges.codes[ve];
      auto eev = code_which_down(code);
      out[e * 2 + eev] = in[ve];
    }
  };
  parallel_for(ncurv_verts, f, "get_curv_edge_vert_flips");
  return out;
}